

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<Qt::Key>::emplace<Qt::Key&>
          (QPodArrayOps<Qt::Key> *this,qsizetype i,Key *args)

{
  bool bVar1;
  qsizetype qVar2;
  Key *pKVar3;
  Key *in_RDX;
  QArrayDataPointer<Qt::Key> *in_RSI;
  long in_RDI;
  Key *where;
  GrowthPosition pos;
  Key tmp;
  bool detach;
  QArrayDataPointer<Qt::Key> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  Key KVar5;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar6;
  
  bVar1 = QArrayDataPointer<Qt::Key>::needsDetach(in_stack_ffffffffffffffd0);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
  if (!bVar1) {
    if ((in_RSI == *(QArrayDataPointer<Qt::Key> **)(in_RDI + 0x10)) &&
       (qVar2 = QArrayDataPointer<Qt::Key>::freeSpaceAtEnd
                          ((QArrayDataPointer<Qt::Key> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      pKVar3 = QArrayDataPointer<Qt::Key>::end(in_stack_ffffffffffffffd0);
      *pKVar3 = *in_RDX;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<Qt::Key> *)0x0) &&
       (qVar2 = QArrayDataPointer<Qt::Key>::freeSpaceAtBegin
                          ((QArrayDataPointer<Qt::Key> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      pKVar3 = QArrayDataPointer<Qt::Key>::begin((QArrayDataPointer<Qt::Key> *)0x3fb74e);
      pKVar3[-1] = *in_RDX;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -4;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
  }
  KVar5 = *in_RDX;
  uVar4 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<Qt::Key> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<Qt::Key>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar6,KVar5),
             (Key **)CONCAT44(uVar4,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  pKVar3 = createHole((QPodArrayOps<Qt::Key> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar6,KVar5),CONCAT44(uVar4,in_stack_ffffffffffffffd8));
  *pKVar3 = KVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }